

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

If_Obj_t * If_ManFanin0Copy(If_Man_t *pIfMan,Gia_Obj_t *pObj)

{
  If_Obj_t *pIVar1;
  
  pIVar1 = If_ManObj(pIfMan,pObj[-(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff)].Value);
  return (If_Obj_t *)((ulong)pIVar1 ^ (ulong)(*(uint *)pObj >> 0x1d & 1));
}

Assistant:

static inline If_Obj_t * If_ManFanin0Copy( If_Man_t * pIfMan, Gia_Obj_t * pObj ) { return If_NotCond( If_ManObj(pIfMan, Gia_ObjValue(Gia_ObjFanin0(pObj))), Gia_ObjFaninC0(pObj) ); }